

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

ByteData * __thiscall
cfd::TransactionController::CreateSignatureHash
          (ByteData *__return_storage_ptr__,TransactionController *this,Txid *txid,uint32_t vout,
          Pubkey *pubkey,SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  undefined4 uVar1;
  ByteData256 sighash;
  Script script;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  SigHashType local_6c [12];
  Script local_60;
  
  cfd::core::ScriptUtil::CreateP2pkhLockingScript((Pubkey *)&local_60);
  uVar1 = cfd::core::Transaction::GetTxInIndex((Txid *)&this->transaction_,(uint)txid);
  cfd::core::Script::GetData();
  cfd::core::SigHashType::SigHashType(local_6c,sighash_type);
  cfd::core::Transaction::GetSignatureHash
            (&local_88,&this->transaction_,uVar1,&local_a0,local_6c,value,version);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
  cfd::core::ByteData256::GetBytes();
  cfd::core::ByteData::ByteData(__return_storage_ptr__,(vector *)&local_a0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  core::Script::~Script(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ByteData TransactionController::CreateSignatureHash(
    const Txid& txid, uint32_t vout, const Pubkey& pubkey,
    SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  Script script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  ByteData256 sighash = transaction_.GetSignatureHash(
      txin_index, script.GetData(), sighash_type, value, version);
  return ByteData(sighash.GetBytes());
}